

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarfproc.cc
# Opt level: O0

uintmax_t __thiscall
pstack::Procman::ExpressionStack::eval
          (ExpressionStack *this,Process *proc,Attribute *attr,StackFrame *frame,Addr reloc)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Form FVar2;
  shared_ptr<pstack::Dwarf::Unit> *psVar3;
  element_type *peVar4;
  ulong uVar5;
  element_type *peVar6;
  undefined8 uVar7;
  unsigned_long uVar8;
  element_type *this_00;
  uintmax_t uVar9;
  uintmax_t uVar10;
  intmax_t iVar11;
  intmax_t iVar12;
  Off OVar13;
  Off OVar14;
  Addr AVar15;
  Block *pBVar16;
  Exception *pEVar17;
  Exception *pEVar18;
  Form local_694;
  Exception local_690;
  csptr local_4f0;
  undefined1 local_4e0 [8];
  DWARFReader r_2;
  Block *block;
  undefined1 local_490 [8];
  DWARFReader exr_2;
  uintmax_t len_2;
  Addr end_2;
  Addr start_2;
  undefined1 local_440 [8];
  DWARFReader r_1;
  string local_410 [32];
  undefined8 local_3f0;
  Section *sec_1;
  Exception local_3e0;
  shared_ptr<const_pstack::Reader> local_240;
  undefined1 local_230 [8];
  DWARFReader exr_1;
  uintmax_t len_1;
  uintmax_t end_1;
  uintmax_t start_1;
  uintmax_t local_1e0;
  uintmax_t idx;
  undefined1 local_1c8 [8];
  DWARFReader exr;
  uintmax_t len;
  uintmax_t end;
  uintmax_t start;
  undefined1 local_180 [7];
  DW_LLE lle;
  undefined1 local_170 [8];
  DWARFReader r;
  string local_140 [32];
  undefined8 local_120;
  Section *addrsec;
  string local_110 [32];
  undefined8 local_f0;
  Section *sec;
  uint64_t base;
  Attribute unitLow;
  DIE local_b0;
  DIE *local_88;
  DIE *unitEntry;
  Addr ip;
  undefined1 local_68 [8];
  ProcessLocation loc;
  Info *dwarf;
  sptr unit;
  Addr reloc_local;
  StackFrame *frame_local;
  Attribute *attr_local;
  Process *proc_local;
  ExpressionStack *this_local;
  
  unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)reloc;
  psVar3 = Dwarf::DIE::getUnit((DIE *)attr);
  std::shared_ptr<pstack::Dwarf::Unit>::shared_ptr((shared_ptr<pstack::Dwarf::Unit> *)&dwarf,psVar3)
  ;
  peVar4 = std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&dwarf);
  loc.codeloc.super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(peVar4 + 200);
  StackFrame::scopeIP((ProcessLocation *)local_68,frame,proc);
  unitEntry = (DIE *)ProcessLocation::location((ProcessLocation *)local_68);
  std::__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &dwarf);
  pstack::Dwarf::Unit::root();
  local_88 = &local_b0;
  pstack::Dwarf::DIE::attribute((AttrName)&base,SUB81(local_88,0));
  _Var1 = unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar5 = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)&base);
  sec = (Section *)((long)&(_Var1._M_pi)->_vptr__Sp_counted_base + uVar5);
  FVar2 = Dwarf::DIE::Attribute::form(attr);
  if (1 < FVar2 - DW_FORM_block) {
    if (FVar2 == DW_FORM_sec_offset) {
      peVar4 = std::
               __shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&dwarf);
      if (4 < *(ushort *)(peVar4 + 0xf0)) {
        peVar6 = std::
                 __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(loc.codeloc.
                                  super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 1));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_110,".debug_loclists",(allocator<char> *)((long)&addrsec + 7));
        uVar7 = pstack::Elf::Object::getDebugSection((string *)peVar6,(uint)local_110);
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator((allocator<char> *)((long)&addrsec + 7));
        local_f0 = uVar7;
        peVar6 = std::
                 __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)(loc.codeloc.
                                  super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 1));
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (local_140,".debug_addr",(allocator<char> *)&r.field_0x27);
        uVar7 = pstack::Elf::Object::getDebugSection((string *)peVar6,(uint)local_140);
        std::__cxx11::string::~string(local_140);
        std::allocator<char>::~allocator((allocator<char> *)&r.field_0x27);
        local_120 = uVar7;
        pstack::Elf::Section::io();
        uVar5 = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long(attr);
        uVar8 = std::numeric_limits<unsigned_long>::max();
        Dwarf::DWARFReader::DWARFReader((DWARFReader *)local_170,(csptr *)local_180,uVar5,uVar8);
        std::shared_ptr<const_pstack::Reader>::~shared_ptr
                  ((shared_ptr<const_pstack::Reader> *)local_180);
        do {
          start._7_1_ = Dwarf::DWARFReader::getu8((DWARFReader *)local_170);
          _Var1 = unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount;
          switch(start._7_1_) {
          case '\0':
            goto switchD_001c66c8_caseD_0;
          case '\x01':
            local_1e0 = Dwarf::DWARFReader::getuleb128((DWARFReader *)local_170);
            pstack::Elf::Section::io();
            this_00 = std::
                      __shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&start_1);
            uVar9 = local_1e0;
            peVar4 = std::
                     __shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&dwarf);
            Reader::readObj<unsigned_long>
                      (this_00,uVar9 * (byte)peVar4[0x100],(unsigned_long *)&sec,1);
            std::shared_ptr<const_pstack::Reader>::~shared_ptr
                      ((shared_ptr<const_pstack::Reader> *)&start_1);
            break;
          default:
            sec_1._7_1_ = 1;
            pEVar17 = (Exception *)__cxa_allocate_exception();
            memset(&local_3e0,0,0x1a0);
            Exception::Exception(&local_3e0);
            pEVar18 = Exception::operator<<(&local_3e0,(char (*) [18])"unhandled DW_LLE_");
            pEVar18 = Exception::operator<<(pEVar18,(DW_LLE *)((long)&start + 7));
            Exception::Exception(pEVar17,pEVar18);
            sec_1._7_1_ = 0;
            __cxa_throw(pEVar17,&Exception::typeinfo,Exception::~Exception);
          case '\x04':
            uVar9 = Dwarf::DWARFReader::getuleb128((DWARFReader *)local_170);
            uVar10 = Dwarf::DWARFReader::getuleb128((DWARFReader *)local_170);
            exr._32_8_ = Dwarf::DWARFReader::getuleb128((DWARFReader *)local_170);
            if (((DIE *)(sec + uVar9) <= unitEntry) && (unitEntry < (DIE *)(sec + uVar10))) {
              std::shared_ptr<const_pstack::Reader>::shared_ptr
                        ((shared_ptr<const_pstack::Reader> *)&idx,
                         (shared_ptr<const_pstack::Reader> *)&r.end);
              OVar13 = Dwarf::DWARFReader::getOffset((DWARFReader *)local_170);
              OVar14 = Dwarf::DWARFReader::getOffset((DWARFReader *)local_170);
              Dwarf::DWARFReader::DWARFReader
                        ((DWARFReader *)local_1c8,(csptr *)&idx,OVar13,OVar14 + exr._32_8_);
              std::shared_ptr<const_pstack::Reader>::~shared_ptr
                        ((shared_ptr<const_pstack::Reader> *)&idx);
              AVar15 = ProcessLocation::elfReloc((ProcessLocation *)local_68);
              this_local = (ExpressionStack *)eval(this,proc,(DWARFReader *)local_1c8,frame,AVar15);
              start._0_4_ = 1;
              Dwarf::DWARFReader::~DWARFReader((DWARFReader *)local_1c8);
              goto LAB_001c6d6a;
            }
            Dwarf::DWARFReader::skip((DWARFReader *)local_170,exr._32_8_);
            break;
          case '\x06':
            peVar4 = std::
                     __shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&dwarf);
            uVar9 = Dwarf::DWARFReader::getuint((DWARFReader *)local_170,(ulong)(byte)peVar4[0x100])
            ;
            sec = (Section *)((long)&(_Var1._M_pi)->_vptr__Sp_counted_base + uVar9);
            break;
          case '\b':
            peVar4 = std::
                     __shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)&dwarf);
            uVar9 = Dwarf::DWARFReader::getuint((DWARFReader *)local_170,(ulong)(byte)peVar4[0x100])
            ;
            uVar10 = Dwarf::DWARFReader::getuleb128((DWARFReader *)local_170);
            exr_1._32_8_ = Dwarf::DWARFReader::getuleb128((DWARFReader *)local_170);
            if (((DIE *)(sec + uVar9) <= unitEntry) && (unitEntry < (DIE *)(sec + uVar9 + uVar10)))
            {
              std::shared_ptr<const_pstack::Reader>::shared_ptr
                        (&local_240,(shared_ptr<const_pstack::Reader> *)&r.end);
              OVar13 = Dwarf::DWARFReader::getOffset((DWARFReader *)local_170);
              OVar14 = Dwarf::DWARFReader::getOffset((DWARFReader *)local_170);
              Dwarf::DWARFReader::DWARFReader
                        ((DWARFReader *)local_230,&local_240,OVar13,OVar14 + exr_1._32_8_);
              std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_240);
              AVar15 = ProcessLocation::elfReloc((ProcessLocation *)local_68);
              this_local = (ExpressionStack *)eval(this,proc,(DWARFReader *)local_230,frame,AVar15);
              start._0_4_ = 1;
              Dwarf::DWARFReader::~DWARFReader((DWARFReader *)local_230);
              goto LAB_001c6d6a;
            }
            Dwarf::DWARFReader::skip((DWARFReader *)local_170,exr_1._32_8_);
          }
        } while( true );
      }
      peVar6 = std::
               __shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pstack::Elf::Object,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(loc.codeloc.
                              super___shared_ptr<pstack::Procman::CodeLocation,_(__gnu_cxx::_Lock_policy)2>
                              ._M_refcount._M_pi + 1));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_410,".debug_loc",(allocator<char> *)&r_1.field_0x27);
      uVar7 = pstack::Elf::Object::getDebugSection((string *)peVar6,(uint)local_410);
      std::__cxx11::string::~string(local_410);
      std::allocator<char>::~allocator((allocator<char> *)&r_1.field_0x27);
      local_3f0 = uVar7;
      pstack::Elf::Section::io();
      uVar5 = pstack::Dwarf::DIE::Attribute::operator_cast_to_unsigned_long(attr);
      uVar8 = std::numeric_limits<unsigned_long>::max();
      Dwarf::DWARFReader::DWARFReader((DWARFReader *)local_440,(csptr *)&start_2,uVar5,uVar8);
      std::shared_ptr<const_pstack::Reader>::~shared_ptr
                ((shared_ptr<const_pstack::Reader> *)&start_2);
      while( true ) {
        iVar11 = Dwarf::DWARFReader::getint((DWARFReader *)local_440,8);
        iVar12 = Dwarf::DWARFReader::getint((DWARFReader *)local_440,8);
        if ((iVar11 == 0) && (iVar12 == 0)) {
          this_local = (ExpressionStack *)0x0;
          start._0_4_ = 1;
          goto LAB_001c70eb;
        }
        exr_2._32_8_ = Dwarf::DWARFReader::getuint((DWARFReader *)local_440,2);
        if (((DIE *)(sec + iVar11) <= unitEntry) && (unitEntry < (DIE *)(sec + iVar12))) break;
        Dwarf::DWARFReader::skip((DWARFReader *)local_440,exr_2._32_8_);
      }
      std::shared_ptr<const_pstack::Reader>::shared_ptr
                ((shared_ptr<const_pstack::Reader> *)&block,
                 (shared_ptr<const_pstack::Reader> *)&r_1.end);
      OVar13 = Dwarf::DWARFReader::getOffset((DWARFReader *)local_440);
      OVar14 = Dwarf::DWARFReader::getOffset((DWARFReader *)local_440);
      Dwarf::DWARFReader::DWARFReader
                ((DWARFReader *)local_490,(csptr *)&block,OVar13,
                 OVar14 + (exr_2._32_8_ & 0xffffffff));
      std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)&block)
      ;
      AVar15 = ProcessLocation::elfReloc((ProcessLocation *)local_68);
      this_local = (ExpressionStack *)eval(this,proc,(DWARFReader *)local_490,frame,AVar15);
      start._0_4_ = 1;
      Dwarf::DWARFReader::~DWARFReader((DWARFReader *)local_490);
LAB_001c70eb:
      Dwarf::DWARFReader::~DWARFReader((DWARFReader *)local_440);
      goto LAB_001c7333;
    }
    if (FVar2 != DW_FORM_exprloc) {
      pEVar17 = (Exception *)__cxa_allocate_exception();
      memset(&local_690,0,0x1a0);
      Exception::Exception(&local_690);
      pEVar18 = Exception::operator<<(&local_690,(char (*) [26])"unhandled attribute form ");
      local_694 = Dwarf::DIE::Attribute::form(attr);
      pEVar18 = Exception::operator<<(pEVar18,&local_694);
      pEVar18 = Exception::operator<<(pEVar18,(char (*) [23])" evaluating expression");
      Exception::Exception(pEVar17,pEVar18);
      __cxa_throw(pEVar17,&Exception::typeinfo,Exception::~Exception);
    }
  }
  pBVar16 = Dwarf::DIE::Attribute::operator_cast_to_Block_(attr);
  r_2._32_8_ = pBVar16->offset;
  OVar13 = pBVar16->length;
  pstack::Elf::Section::io();
  Dwarf::DWARFReader::DWARFReader
            ((DWARFReader *)local_4e0,&local_4f0,r_2._32_8_,r_2._32_8_ + OVar13);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr(&local_4f0);
  this_local = (ExpressionStack *)
               eval(this,proc,(DWARFReader *)local_4e0,frame,
                    (Addr)unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi);
  start._0_4_ = 1;
  Dwarf::DWARFReader::~DWARFReader((DWARFReader *)local_4e0);
  goto LAB_001c7333;
switchD_001c66c8_caseD_0:
  this_local = (ExpressionStack *)0x0;
  start._0_4_ = 1;
LAB_001c6d6a:
  Dwarf::DWARFReader::~DWARFReader((DWARFReader *)local_170);
LAB_001c7333:
  Dwarf::DIE::Attribute::~Attribute((Attribute *)&base);
  Dwarf::DIE::~DIE(&local_b0);
  ProcessLocation::~ProcessLocation((ProcessLocation *)local_68);
  std::shared_ptr<pstack::Dwarf::Unit>::~shared_ptr((shared_ptr<pstack::Dwarf::Unit> *)&dwarf);
  return (uintmax_t)this_local;
}

Assistant:

uintmax_t
ExpressionStack::eval(Process &proc, const Dwarf::DIE::Attribute &attr,
                      const StackFrame *frame, Elf::Addr reloc)
{
    Dwarf::Unit::sptr unit = attr.die.getUnit();
    const Dwarf::Info *dwarf = unit->dwarf;
    auto loc = frame->scopeIP(proc);
    auto ip = loc.location();

    const auto &unitEntry = unit->root();
    auto unitLow = unitEntry.attribute(Dwarf::DW_AT_low_pc);

    // default base address is relocation of the object + base of unit.
    uint64_t base = reloc + uintmax_t(unitLow);

    switch (attr.form()) {
        case Dwarf::DW_FORM_sec_offset:
            if (unit->version >= 5) {
                // For dwarf 5, this will be a debug_loclists entry.
                const Elf::Section &sec = dwarf->elf->getDebugSection(".debug_loclists", SHT_NULL);
                const Elf::Section &addrsec = dwarf->elf->getDebugSection(".debug_addr", SHT_NULL);
                Dwarf::DWARFReader r(sec.io(), uintmax_t(attr));
                for (;;) {
                    auto lle = DW_LLE(r.getu8());
                    switch (lle) {
                        case DW_LLE_end_of_list:
                            return 0; // failed to find a loclist for the given IP.

                        case DW_LLE_offset_pair:
                        {
                            auto start = r.getuleb128();
                            auto end = r.getuleb128();
                            auto len = r.getuleb128();
                            if (base + start <= ip && ip < base + end) {
                                Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + len);
                               return eval(proc, exr, frame, loc.elfReloc());
                            }
                            r.skip(len);
                            break;
                        }

                        case DW_LLE_base_address:
                            base = reloc + r.getuint(unit->addrlen);
                            break;

                        case DW_LLE_base_addressx:
                            {
                            auto idx = r.getuleb128();
                            addrsec.io()->readObj(idx * unit->addrlen, &base);
                            }
                            break;

                        case DW_LLE_start_length: {
                            auto start = r.getuint(unit->addrlen);
                            auto end = start + r.getuleb128();
                            auto len = r.getuleb128();
                            if (base + start <= ip && ip < base + end) {
                                Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + len);
                               return eval(proc, exr, frame, loc.elfReloc());
                            }
                            r.skip(len);
                            break;
                        }
                        default:
                            throw (Exception() << "unhandled DW_LLE_" << lle);
                    }
                }
            } else {
                // For dwarf 4, this will be a debug_loc entry.
                auto &sec = dwarf->elf->getDebugSection(".debug_loc", SHT_NULL);

                // convert this object-relative addr to a unit-relative one
                Dwarf::DWARFReader r(sec.io(), uintmax_t(attr));
                for (;;) {
                    Elf::Addr start = r.getint(sizeof start);
                    Elf::Addr end = r.getint(sizeof end);
                    if (start == 0 && end == 0)
                        return 0;
                    auto len = r.getuint(2);
                    if (ip >= base + start && ip < base + end) {
                        Dwarf::DWARFReader exr(r.io, r.getOffset(), r.getOffset() + Elf::Word(len));
                        return eval(proc, exr, frame, loc.elfReloc());
                    }
                    r.skip(len);
                }
            }
            throw (Exception() << ".debug_loc search failed");

        case Dwarf::DW_FORM_block1:
        case Dwarf::DW_FORM_block:
        case Dwarf::DW_FORM_exprloc: {
            const auto &block = Dwarf::Block(attr);
            Dwarf::DWARFReader r(dwarf->debugInfo.io(), block.offset, block.offset + block.length);
            return eval(proc, r, frame, reloc);
        }
        default:
            throw (Exception() << "unhandled attribute form " << attr.form() << " evaluating expression");
    }
}